

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_common_z2_operators<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
               (vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                *matrix)

{
  pointer pSVar1;
  ID_index IVar2;
  Column_dimension_option CVar3;
  ID_index IVar4;
  bool bVar5;
  Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  *pSVar6;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> setcont;
  anon_class_1_0_00000001 local_3d2;
  anon_class_1_0_00000001 local_3d1;
  char *local_3d0;
  char *local_3c8;
  anon_class_1_0_00000001 local_3c0 [8];
  undefined8 local_3b8;
  shared_count sStack_3b0;
  anon_class_8_1_e4bd5e45 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  anon_class_1_0_00000001 *local_390;
  vector<bool,_std::allocator<bool>_> local_388;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_360;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_360._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_360._M_impl.super__Rb_tree_header._M_header;
  local_360._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_360._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_360._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_388.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_388.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_388.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_388.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_388.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pSVar6 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3a8.targetColumn = pSVar6;
  local_360._M_impl.super__Rb_tree_header._M_header._M_right =
       local_360._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar5 = Gudhi::persistence_matrix::
          _generic_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>(Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>const&,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_opt____matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>*>&)_1_>
                    (pSVar6 + 1,pSVar6,local_3c0,&local_3a8,(anon_class_1_0_00000001 *)&local_3d0,
                     &local_3d1,&local_3d2);
  if (bVar5) {
    CVar3.dim_ = (pSVar6->super_Column_dimension_option).dim_;
    IVar4 = (pSVar6->super_Chain_column_option).pivot_;
    IVar2 = pSVar6[1].super_Chain_column_option.pivot_;
    pSVar6->super_Column_dimension_option =
         (Column_dimension_option)pSVar6[1].super_Column_dimension_option.dim_;
    (pSVar6->super_Chain_column_option).pivot_ = IVar2;
    pSVar6[1].super_Column_dimension_option = (Column_dimension_option)CVar3.dim_;
    pSVar6[1].super_Chain_column_option.pivot_ = IVar4;
  }
  pSVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3a8.targetColumn = pSVar1 + 1;
  bVar5 = Gudhi::persistence_matrix::
          _generic_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>(Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>const&,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_opt____matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>*>&)_1_>
                    (pSVar1 + 2,local_3a8.targetColumn,local_3c0,&local_3a8,
                     (anon_class_1_0_00000001 *)&local_3d0,&local_3d1,&local_3d2);
  if (bVar5) {
    CVar3.dim_ = pSVar1[1].super_Column_dimension_option.dim_;
    IVar4 = pSVar1[1].super_Chain_column_option.pivot_;
    IVar2 = pSVar1[2].super_Chain_column_option.pivot_;
    pSVar1[1].super_Column_dimension_option =
         (Column_dimension_option)pSVar1[2].super_Column_dimension_option.dim_;
    pSVar1[1].super_Chain_column_option.pivot_ = IVar2;
    pSVar1[2].super_Column_dimension_option = (Column_dimension_option)CVar3.dim_;
    pSVar1[2].super_Chain_column_option.pivot_ = IVar4;
  }
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)0x300000002;
  uStack_3a0 = CONCAT44(uStack_3a0._4_4_,6);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_assign_unique<unsigned_int_const*>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_360,(uint *)&local_3a8,(uint *)((long)&uStack_3a0 + 4));
  local_3a8.targetColumn._0_7_ = 0x1000001010000;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_388,&local_3a8);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,unsigned_int>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_360
             ,&local_388);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x1c5);
  pSVar6 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + 1;
  local_3c0[0] = (anon_class_1_0_00000001)Gudhi::persistence_matrix::operator==(pSVar6,pSVar6);
  local_3b8 = 0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "matrix[1] == matrix[1]";
  local_3c8 = "";
  uStack_3a0 = uStack_3a0 & 0xffffffffffffff00;
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db3b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_390 = (anon_class_1_0_00000001 *)&local_3d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x1c6);
  pSVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3c0[0] = (anon_class_1_0_00000001)
                 Gudhi::persistence_matrix::operator==(pSVar1 + 1,pSVar1 + 3);
  local_3b8 = 0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "matrix[1] == matrix[3]";
  local_3c8 = "";
  uStack_3a0 = uStack_3a0 & 0xffffffffffffff00;
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db3b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  local_390 = (anon_class_1_0_00000001 *)&local_3d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x1c7);
  pSVar6 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3c0[0] = (anon_class_1_0_00000001)Gudhi::persistence_matrix::operator<(pSVar6 + 1,pSVar6);
  local_3b8 = 0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "matrix[1] < matrix[0]";
  local_3c8 = "";
  uStack_3a0 = uStack_3a0 & 0xffffffffffffff00;
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db3b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_390 = (anon_class_1_0_00000001 *)&local_3d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x1cb);
  pSVar6 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3c0[0] = (anon_class_1_0_00000001)Gudhi::persistence_matrix::operator<(pSVar6 + 2,pSVar6);
  local_3b8 = 0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "matrix[2] < matrix[0]";
  local_3c8 = "";
  uStack_3a0 = uStack_3a0 & 0xffffffffffffff00;
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db3b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_390 = (anon_class_1_0_00000001 *)&local_3d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x1cd);
  pSVar6 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar5 = Gudhi::persistence_matrix::operator<(pSVar6,pSVar6);
  local_3c0[0] = (anon_class_1_0_00000001)!bVar5;
  local_3b8 = 0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "!(matrix[0] < matrix[0])";
  local_3c8 = "";
  uStack_3a0 = uStack_3a0 & 0xffffffffffffff00;
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db3b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_118 = "";
  local_390 = (anon_class_1_0_00000001 *)&local_3d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)0x300000002;
  uStack_3a0 = CONCAT44(uStack_3a0._4_4_,6);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_assign_unique<unsigned_int_const*>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_360,(uint *)&local_3a8,(uint *)((long)&uStack_3a0 + 4));
  local_3a8.targetColumn._0_7_ = 0x1000001010000;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_388,&local_3a8);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,unsigned_int>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_360
             ,&local_388);
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)0x100000000;
  uStack_3a0 = 0x500000002;
  local_398 = (undefined8 *)CONCAT44(local_398._4_4_,6);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_assign_unique<unsigned_int_const*>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_360,(uint *)&local_3a8,(uint *)((long)&local_398 + 4));
  local_3a8.targetColumn._0_7_ = 0x1010000010101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_388,&local_3a8);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,unsigned_int>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 2,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_360
             ,&local_388);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x1d8);
  pSVar6 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar5 = Gudhi::persistence_matrix::operator==(pSVar6,pSVar6 + 2);
  local_3c0[0] = (anon_class_1_0_00000001)!bVar5;
  local_3b8 = 0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "!(matrix[0] == matrix[2])";
  local_3c8 = "";
  uStack_3a0 = uStack_3a0 & 0xffffffffffffff00;
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db3b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_148 = "";
  local_390 = (anon_class_1_0_00000001 *)&local_3d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x1d9);
  pSVar6 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + 2;
  local_3c0[0] = (anon_class_1_0_00000001)Gudhi::persistence_matrix::operator==(pSVar6,pSVar6);
  local_3b8 = 0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "matrix[2] == matrix[2]";
  local_3c8 = "";
  uStack_3a0 = uStack_3a0 & 0xffffffffffffff00;
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db3b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_178 = "";
  local_390 = (anon_class_1_0_00000001 *)&local_3d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x1da);
  pSVar6 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3c0[0] = (anon_class_1_0_00000001)Gudhi::persistence_matrix::operator<(pSVar6 + 1,pSVar6);
  local_3b8 = 0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "matrix[1] < matrix[0]";
  local_3c8 = "";
  uStack_3a0 = uStack_3a0 & 0xffffffffffffff00;
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db3b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1a8 = "";
  local_390 = (anon_class_1_0_00000001 *)&local_3d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x1de);
  pSVar6 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3c0[0] = (anon_class_1_0_00000001)Gudhi::persistence_matrix::operator<(pSVar6 + 2,pSVar6);
  local_3b8 = 0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "matrix[2] < matrix[0]";
  local_3c8 = "";
  uStack_3a0 = uStack_3a0 & 0xffffffffffffff00;
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db3b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1d8 = "";
  local_390 = (anon_class_1_0_00000001 *)&local_3d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x1e0);
  pSVar6 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar5 = Gudhi::persistence_matrix::operator<(pSVar6,pSVar6);
  local_3c0[0] = (anon_class_1_0_00000001)!bVar5;
  local_3b8 = 0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "!(matrix[0] < matrix[0])";
  local_3c8 = "";
  uStack_3a0 = uStack_3a0 & 0xffffffffffffff00;
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db3b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_208 = "";
  local_390 = (anon_class_1_0_00000001 *)&local_3d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  pSVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3a8.targetColumn = pSVar1 + 4;
  bVar5 = Gudhi::persistence_matrix::
          _generic_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>(Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>const&,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_opt____matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>*>&)_1_>
                    (pSVar1 + 5,local_3a8.targetColumn,local_3c0,&local_3a8,
                     (anon_class_1_0_00000001 *)&local_3d0,&local_3d1,&local_3d2);
  if (bVar5) {
    CVar3.dim_ = pSVar1[4].super_Column_dimension_option.dim_;
    IVar4 = pSVar1[4].super_Chain_column_option.pivot_;
    IVar2 = pSVar1[5].super_Chain_column_option.pivot_;
    pSVar1[4].super_Column_dimension_option =
         (Column_dimension_option)pSVar1[5].super_Column_dimension_option.dim_;
    pSVar1[4].super_Chain_column_option.pivot_ = IVar2;
    pSVar1[5].super_Column_dimension_option = (Column_dimension_option)CVar3.dim_;
    pSVar1[5].super_Chain_column_option.pivot_ = IVar4;
  }
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)0x300000002;
  uStack_3a0 = CONCAT44(uStack_3a0._4_4_,6);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_assign_unique<unsigned_int_const*>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_360,(uint *)&local_3a8,(uint *)((long)&uStack_3a0 + 4));
  local_3a8.targetColumn._0_7_ = 0x1000001010000;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_388,&local_3a8);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,unsigned_int>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 4,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_360
             ,&local_388);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x1e7);
  pSVar6 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3c0[0] = (anon_class_1_0_00000001)Gudhi::persistence_matrix::operator==(pSVar6 + 4,pSVar6);
  local_3b8 = 0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "matrix[4] == matrix[0]";
  local_3c8 = "";
  uStack_3a0 = uStack_3a0 & 0xffffffffffffff00;
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db3b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_238 = "";
  local_390 = (anon_class_1_0_00000001 *)&local_3d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  pSVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3a8.targetColumn = pSVar1 + 5;
  bVar5 = Gudhi::persistence_matrix::
          _generic_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>(Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>const&,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_opt____matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>*>&)_1_>
                    (pSVar1 + 3,local_3a8.targetColumn,local_3c0,&local_3a8,
                     (anon_class_1_0_00000001 *)&local_3d0,&local_3d1,&local_3d2);
  if (bVar5) {
    IVar2 = pSVar1[3].super_Chain_column_option.pivot_;
    CVar3.dim_ = pSVar1[5].super_Column_dimension_option.dim_;
    IVar4 = pSVar1[5].super_Chain_column_option.pivot_;
    pSVar1[5].super_Column_dimension_option =
         (Column_dimension_option)pSVar1[3].super_Column_dimension_option.dim_;
    pSVar1[5].super_Chain_column_option.pivot_ = IVar2;
    pSVar1[3].super_Column_dimension_option = (Column_dimension_option)CVar3.dim_;
    pSVar1[3].super_Chain_column_option.pivot_ = IVar4;
  }
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)0x100000000;
  uStack_3a0 = 0x500000002;
  local_398 = (undefined8 *)CONCAT44(local_398._4_4_,6);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_assign_unique<unsigned_int_const*>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_360,(uint *)&local_3a8,(uint *)((long)&local_398 + 4));
  local_3a8.targetColumn._0_7_ = 0x1010000010101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_388,&local_3a8);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,unsigned_int>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 5,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_360
             ,&local_388);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x1ed);
  pSVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3c0[0] = (anon_class_1_0_00000001)
                 Gudhi::persistence_matrix::operator==(pSVar1 + 5,pSVar1 + 2);
  local_3b8 = 0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "matrix[5] == matrix[2]";
  local_3c8 = "";
  uStack_3a0 = uStack_3a0 & 0xffffffffffffff00;
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db3b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_268 = "";
  local_390 = (anon_class_1_0_00000001 *)&local_3d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  pSVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3a8.targetColumn = pSVar1 + 5;
  bVar5 = Gudhi::persistence_matrix::
          _generic_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>(Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>const&,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_opt____matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>*>&)_1_>
                    (pSVar1 + 4,local_3a8.targetColumn,local_3c0,&local_3a8,
                     (anon_class_1_0_00000001 *)&local_3d0,&local_3d1,&local_3d2);
  if (bVar5) {
    IVar2 = pSVar1[4].super_Chain_column_option.pivot_;
    CVar3.dim_ = pSVar1[5].super_Column_dimension_option.dim_;
    IVar4 = pSVar1[5].super_Chain_column_option.pivot_;
    pSVar1[5].super_Column_dimension_option =
         (Column_dimension_option)pSVar1[4].super_Column_dimension_option.dim_;
    pSVar1[5].super_Chain_column_option.pivot_ = IVar2;
    pSVar1[4].super_Column_dimension_option = (Column_dimension_option)CVar3.dim_;
    pSVar1[4].super_Chain_column_option.pivot_ = IVar4;
  }
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)0x100000000;
  uStack_3a0 = 0x500000003;
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_assign_unique<unsigned_int_const*>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_360,(uint *)&local_3a8,(uint *)&local_398);
  local_3a8.targetColumn._0_7_ = 0x10001000101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_388,&local_3a8);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,unsigned_int>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 5,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_360
             ,&local_388);
  pSVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3a8.targetColumn = pSVar1 + 3;
  bVar5 = Gudhi::persistence_matrix::
          _generic_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>(Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>const&,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_opt____matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>*>&)_1_>
                    (pSVar1 + 5,local_3a8.targetColumn,local_3c0,&local_3a8,
                     (anon_class_1_0_00000001 *)&local_3d0,&local_3d1,&local_3d2);
  if (bVar5) {
    CVar3.dim_ = pSVar1[3].super_Column_dimension_option.dim_;
    IVar4 = pSVar1[3].super_Chain_column_option.pivot_;
    IVar2 = pSVar1[5].super_Chain_column_option.pivot_;
    pSVar1[3].super_Column_dimension_option =
         (Column_dimension_option)pSVar1[5].super_Column_dimension_option.dim_;
    pSVar1[3].super_Chain_column_option.pivot_ = IVar2;
    pSVar1[5].super_Column_dimension_option = (Column_dimension_option)CVar3.dim_;
    pSVar1[5].super_Chain_column_option.pivot_ = IVar4;
  }
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)0x100000000;
  uStack_3a0 = 0x500000003;
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_assign_unique<unsigned_int_const*>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_360,(uint *)&local_3a8,(uint *)&local_398);
  local_3a8.targetColumn._0_7_ = 0x10001000101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_388,&local_3a8);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,unsigned_int>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 3,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_360
             ,&local_388);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x1f8);
  pSVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3c0[0] = (anon_class_1_0_00000001)
                 Gudhi::persistence_matrix::operator==(pSVar1 + 3,pSVar1 + 5);
  local_3b8 = 0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "matrix[3] == matrix[5]";
  local_3c8 = "";
  uStack_3a0 = uStack_3a0 & 0xffffffffffffff00;
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db3b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_298 = "";
  local_390 = (anon_class_1_0_00000001 *)&local_3d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x1f9);
  pSVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar5 = Gudhi::persistence_matrix::operator<(pSVar1 + 5,pSVar1 + 3);
  local_3c0[0] = (anon_class_1_0_00000001)!bVar5;
  local_3b8 = 0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "!(matrix[5] < matrix[3])";
  local_3c8 = "";
  uStack_3a0 = uStack_3a0 & 0xffffffffffffff00;
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db3b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_2c8 = "";
  local_390 = (anon_class_1_0_00000001 *)&local_3d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x1fa);
  pSVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar5 = Gudhi::persistence_matrix::operator<(pSVar1 + 3,pSVar1 + 5);
  local_3c0[0] = (anon_class_1_0_00000001)!bVar5;
  local_3b8 = 0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "!(matrix[3] < matrix[5])";
  local_3c8 = "";
  uStack_3a0 = uStack_3a0 & 0xffffffffffffff00;
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db3b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_2f8 = "";
  local_390 = (anon_class_1_0_00000001 *)&local_3d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x1fb);
  pSVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3c0[0] = (anon_class_1_0_00000001)
                 Gudhi::persistence_matrix::operator<(pSVar1 + 5,pSVar1 + 4);
  local_3b8 = 0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "matrix[5] < matrix[4]";
  local_3c8 = "";
  uStack_3a0 = uStack_3a0 & 0xffffffffffffff00;
  local_3a8.targetColumn =
       (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
        *)&PTR__lazy_ostream_001db3b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_328 = "";
  local_390 = (anon_class_1_0_00000001 *)&local_3d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  if (local_388.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_388.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_388.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_388.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_360);
  return;
}

Assistant:

void column_test_common_z2_operators(std::vector<Column>& matrix) {
  std::set<unsigned int> setcont;
  std::vector<typename Column::Field_element> veccont;

  matrix[0] += matrix[1];
  matrix[1] += matrix[2];

  setcont = {2, 3, 6};
  veccont = {0, 0, 1, 1, 0, 0, 1};
  column_test_common_content_access(matrix[0], setcont, veccont);
  BOOST_CHECK(matrix[1] == matrix[1]);
  BOOST_CHECK(matrix[1] == matrix[3]);
  BOOST_CHECK(matrix[1] < matrix[0]);
  if constexpr (Column::Master::Option_list::column_type == Column_types::HEAP) {
    BOOST_CHECK(matrix[0] < matrix[2]);  // order different for heap columns
  } else {
    BOOST_CHECK(matrix[2] < matrix[0]);
  }
  BOOST_CHECK(!(matrix[0] < matrix[0]));

  matrix[0] *= 5;
  matrix[2] *= 1;

  setcont = {2, 3, 6};
  veccont = {0, 0, 1, 1, 0, 0, 1};
  column_test_common_content_access(matrix[0], setcont, veccont);
  setcont = {0, 1, 2, 5, 6};
  veccont = {1, 1, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[2], setcont, veccont);
  BOOST_CHECK(!(matrix[0] == matrix[2]));
  BOOST_CHECK(matrix[2] == matrix[2]);
  BOOST_CHECK(matrix[1] < matrix[0]);
  if constexpr (Column::Master::Option_list::column_type == Column_types::HEAP) {
    BOOST_CHECK(matrix[0] < matrix[2]);  // order different for heap columns
  } else {
    BOOST_CHECK(matrix[2] < matrix[0]);
  }
  BOOST_CHECK(!(matrix[0] < matrix[0]));

  // this = v * this + column
  matrix[4].multiply_target_and_add(3, matrix[5]);
  setcont = {2, 3, 6};
  veccont = {0, 0, 1, 1, 0, 0, 1};
  column_test_common_content_access(matrix[4], setcont, veccont);
  BOOST_CHECK(matrix[4] == matrix[0]);
  // this = this + column * v
  matrix[5].multiply_source_and_add(matrix[3], 3);
  setcont = {0, 1, 2, 5, 6};
  veccont = {1, 1, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[5], setcont, veccont);
  BOOST_CHECK(matrix[5] == matrix[2]);
  // this = this + column * v
  matrix[5].multiply_source_and_add(matrix[4], 3);
  setcont = {0, 1, 3, 5};
  veccont = {1, 1, 0, 1, 0, 1, 0};
  column_test_common_content_access(matrix[5], setcont, veccont);
  // this = v * this + column
  matrix[3].multiply_target_and_add(3, matrix[5]);
  setcont = {0, 1, 3, 5};
  veccont = {1, 1, 0, 1, 0, 1, 0};
  column_test_common_content_access(matrix[3], setcont, veccont);
  BOOST_CHECK(matrix[3] == matrix[5]);
  BOOST_CHECK(!(matrix[5] < matrix[3]));
  BOOST_CHECK(!(matrix[3] < matrix[5]));
  BOOST_CHECK(matrix[5] < matrix[4]);
}